

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O0

void osQueue::dump_info(ostream *out)

{
  osQueue *this;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  osQueue *queue;
  size_t i;
  ostream *out_local;
  
  osMutex::Take(&QueueListLock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0xaa);
  for (queue = (osQueue *)0x0; queue < (osQueue *)0x14; queue = (osQueue *)((long)&queue->Array + 1)
      ) {
    this = QueueList[(long)queue];
    if (this != (osQueue *)0x0) {
      poVar2 = std::operator<<(out,"Queue ");
      pcVar3 = GetName(this);
      std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(out," is size ");
      std::ostream::operator<<(poVar2,this->MaxElements);
      poVar2 = std::operator<<(out," and contains ");
      iVar1 = GetCount(this);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::operator<<(poVar2," objects\n");
    }
  }
  osMutex::Give(&QueueListLock);
  return;
}

Assistant:

void osQueue::dump_info(std::ostream& out)
{
    QueueListLock.Take(__FILE__, __LINE__);
    for (size_t i = 0; i < MAX_QUEUE_COUNT; i++)
    {
        osQueue* queue = QueueList[i];
        if (queue != nullptr)
        {
            out << "Queue " << queue->GetName();
            out << " is size " << queue->MaxElements;
            out << " and contains " << queue->GetCount() << " objects\n";
            // This is hanging
            // can't lock the queue and tx tcp frames as it can deadlock
            // tx tcp locks queues
            // might be a better way to do this
            //         queue->Lock.Take( __FILE__, __LINE__ );
            //         int      index = queue->NextOutIndex;
            //         for( int j = 0; j<queue->GetCount(); j++ )
            //         {
            //            pfunc->Printf( "   Object at 0x%08X\n", queue->Array[ index ] );
            //            index = queue->Increment( index );
            //         }
            //         queue->Lock.Give();
        }
    }

    QueueListLock.Give();
}